

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O3

void __thiscall tst_qpromise_finally::fulfilledSync(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar3;
  PromiseData<int> *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar4;
  _func_int **pp_Var5;
  PromiseResolver<int> PVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  PromiseDataBase<int,_void_(const_int_&)> *this_01;
  PromiseData<int> *pPVar10;
  char *pcVar11;
  char *pcVar12;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_158;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QStack_150;
  _func_int **local_148;
  PromiseData<int> *local_140;
  PromiseData<int> *local_130;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  PromiseResolver<int> resolver_1;
  int value;
  QPromise<int> local_f8;
  function<void_(const_int_&)> local_e8;
  QSharedData *local_c8;
  _func_int **local_c0;
  QPromiseBase<int> local_b8;
  PromiseResolver<int> resolver;
  _Manager_type local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _func_int **local_48;
  _func_int **local_40;
  undefined4 local_34;
  
  value = -1;
  local_34 = 0x2a;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&local_b8,(anon_class_8_1_a8c68091)&local_34);
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cb90;
  if (local_b8.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_b8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130 = local_b8.m_d.d;
  this_01 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012cc30;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  local_c8 = &this_01->super_QSharedData;
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0012cbc8;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012cb90;
  local_e8.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_e8);
  local_48 = (_func_int **)&PTR__PromiseData_0012cbc8;
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012ca58;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_e8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_e8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_e8.super__Function_base._M_functor._8_8_
        != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_e8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar6.m_d.d = resolver.m_d.d;
  local_c0 = (_func_int **)&PTR__QPromiseBase_0012cb90;
  local_40 = (_func_int **)&PTR__PromiseDataBase_0012cc30;
  if (resolver.m_d.d == (Data *)0x0) {
    local_158.d = (Data *)0x0;
LAB_00104a49:
    QStack_150.d = (Data *)0x0;
    bVar7 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_158 = resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_00104a49;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_158 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    QStack_150 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar7 = false;
  }
  QVar3.d = QStack_150.d;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_148 = (_func_int **)&value;
  local_68._M_unused._M_object = operator_new(0x18);
  *(Data **)local_68._M_unused._0_8_ = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_68._M_unused._0_8_ + 8) = QStack_150.d;
  if (QStack_150.d == (Data *)0x0) {
    *(_func_int ***)((long)local_68._M_unused._0_8_ + 0x10) = local_148;
    pcStack_50 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(_func_int ***)((long)local_68._M_unused._0_8_ + 0x10) = local_148;
    pcStack_50 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if (QStack_150.d != (Data *)0x0) {
      LOCK();
      ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_150.d,0x10);
      }
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&local_130->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_158 = PVar6.m_d.d;
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar7) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  QStack_150.d = QVar3.d;
  local_148 = (_func_int **)&value;
  local_88._M_unused._M_object = operator_new(0x18);
  this_00 = local_130;
  *(Data **)local_88._M_unused._0_8_ = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_88._M_unused._0_8_ + 8) = QStack_150.d;
  if (QStack_150.d == (Data *)0x0) {
    *(_func_int ***)((long)local_88._M_unused._0_8_ + 0x10) = local_148;
    pcStack_70 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(_func_int ***)((long)local_88._M_unused._0_8_ + 0x10) = local_148;
    pcStack_70 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if (QStack_150.d != (Data *)0x0) {
      LOCK();
      ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_150.d,0x10);
      }
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (!bVar7) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar3.d,0x10);
    }
  }
  pp_Var5 = local_c0;
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  pPVar10 = (PromiseData<int> *)operator_new(0x68);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_40;
  QReadWriteLock::QReadWriteLock
            (&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_48;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar10 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f8.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var5;
  p.super_QPromiseBase<int>.m_d.d = pPVar10;
  local_f8.super_QPromiseBase<int>.m_d.d = pPVar10;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,&local_f8);
  local_f8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  if (local_f8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_f8.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_f8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_f8.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_110.d = (Data *)0x0;
    local_118.d = (Data *)0x0;
    goto LAB_00104e54;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  local_110 = resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_118.d = (Data *)0x0;
LAB_00104e3f:
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (local_118.d == (Data *)0x0) goto LAB_00104e54;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_118 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00104e3f;
  }
  LOCK();
  ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_00104e54:
  local_140 = this_00;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_148 = pp_Var5;
  local_e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_e8._M_invoker = (_Invoker_type)0x0;
  local_158.d = local_110.d;
  QStack_150.d = local_118.d;
  local_e8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(Data **)local_e8.super__Function_base._M_functor._M_unused._0_8_ = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 8) = QStack_150.d;
  if (QStack_150.d != (Data *)0x0) {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0012ca58;
  *(PromiseData<int> **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_140;
  if (local_140 == (PromiseData<int> *)0x0) {
    *(_func_int ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         pp_Var5;
    local_e8._M_invoker =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
         ::_M_invoke;
    local_e8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
         ::_M_manager;
    local_148 = (_func_int **)&PTR__QPromiseBase_0012ca58;
  }
  else {
    LOCK();
    pQVar2 = &(local_140->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(_func_int ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         pp_Var5;
    local_e8._M_invoker =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
         ::_M_invoke;
    local_e8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
         ::_M_manager;
    local_148 = (_func_int **)&PTR__QPromiseBase_0012ca58;
    if (local_140 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar2 = &(local_140->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_140 != (PromiseData<int> *)0x0)) {
        (*(local_140->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if (QStack_150.d != (Data *)0x0) {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_150.d,0x10);
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler(this_01,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_110,
             (QPromiseResolve<int> *)&local_118,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_118.d != (Data *)0x0) {
    LOCK();
    ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_118.d,0x10);
    }
  }
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var5;
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  if (local_b8.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_b8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_b8.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_b8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                ();
    }
  }
  iVar9 = waitForValue<int>(&p,(int *)0xffffffff);
  cVar8 = QTest::qCompare(iVar9,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x2c);
  QVar4 = p.super_QPromiseBase<int>.m_d;
  if (cVar8 == '\0') {
    if (p.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      return;
    }
  }
  else {
    bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar7 = (bool)(~bVar7 & ((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object == (void *)0x0);
    local_158.d._0_1_ = bVar7;
    local_f8.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_f8.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
    pcVar11 = QTest::toString<bool>((bool *)&local_158);
    pcVar12 = QTest::toString<bool>((bool *)&local_f8);
    cVar8 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x2d);
    if (cVar8 != '\0') {
      QTest::qCompare(value,8,"value","8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                      ,0x2e);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  LOCK();
  pQVar1 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
    (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledSync()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::resolve(42).finally([&]() {
        value = 8;
        return 16; // ignored!
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, 8);
}